

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

branch * dungeon_branch(char *s)

{
  xchar xVar1;
  branch *pbStack_18;
  xchar dnum;
  branch *br;
  char *s_local;
  
  xVar1 = dname_to_dnum(s,'\0');
  for (pbStack_18 = branches; (pbStack_18 != (branch *)0x0 && ((pbStack_18->end2).dnum != xVar1));
      pbStack_18 = pbStack_18->next) {
  }
  if (pbStack_18 != (branch *)0x0) {
    return pbStack_18;
  }
  panic("dgn_entrance: can\'t find entrance to %s",s);
}

Assistant:

branch *dungeon_branch(const char *s)
{
    branch *br;
    xchar  dnum;

    dnum = dname_to_dnum(s, FALSE);

    /* Find the branch that connects to dungeon i's branch. */
    for (br = branches; br; br = br->next)
	if (br->end2.dnum == dnum) break;

    if (!br) panic("dgn_entrance: can't find entrance to %s", s);

    return br;
}